

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_makeByteArray
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  ulong local_30;
  size_t i;
  int16_t *elementOperands_local;
  size_t elementCount_local;
  int16_t resultOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (-1 < resultOperand) {
    sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG1,(int32_t)elementCount);
    sysbvm_jit_x86_call(jit,sysbvm_byteArray_create);
    for (local_30 = 0; local_30 < elementCount; local_30 = local_30 + 1) {
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[local_30]);
      sysbvm_jit_x86_logicalShiftRightImmediate(jit,SYSBVM_X86_64_ARG2,'\x04');
      sysbvm_jit_x86_mov8IntoMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,(int)local_30 + 0x10,SYSBVM_X86_64_ARG2);
    }
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,SYSBVM_X86_64_CALL_SHADOW_SPACE);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeByteArray(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_byteArray_create);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_logicalShiftRightImmediate(jit, SYSBVM_X86_64_ARG2, SYSBVM_TUPLE_TAG_BIT_COUNT);
        sysbvm_jit_x86_mov8IntoMemoryWithOffset(jit, SYSBVM_X86_RAX, (int32_t) (sizeof(sysbvm_tuple_header_t) + i), SYSBVM_X86_64_ARG2);
    }

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}